

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_wav_preinit_write
                    (ma_dr_wav *pWav,ma_dr_wav_data_format *pFormat,ma_bool32 isSequential,
                    ma_dr_wav_write_proc onWrite,ma_dr_wav_seek_proc onSeek,void *pUserData,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  ma_uint32 mVar3;
  _func_void_ptr_size_t_void_ptr *p_Var4;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var5;
  _func_void_void_ptr_void_ptr *p_Var6;
  uint uVar7;
  ma_bool32 mVar8;
  ma_bool32 mVar9;
  
  mVar8 = 0;
  mVar9 = 0;
  if ((((onWrite != (ma_dr_wav_write_proc)0x0 && pWav != (ma_dr_wav *)0x0) &&
       (mVar9 = mVar8, isSequential != 0 || onSeek != (ma_dr_wav_seek_proc)0x0)) &&
      (mVar1 = pFormat->format, mVar1 != 2)) && ((mVar1 != 0x11 && (mVar1 != 0xfffe)))) {
    memset(pWav,0,400);
    pWav->onWrite = onWrite;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      (pWav->allocationCallbacks).onMalloc = ma_dr_wav__malloc_default;
      (pWav->allocationCallbacks).onRealloc = ma_dr_wav__realloc_default;
      (pWav->allocationCallbacks).onFree = ma_dr_wav__free_default;
    }
    else {
      p_Var4 = pAllocationCallbacks->onMalloc;
      p_Var5 = pAllocationCallbacks->onRealloc;
      p_Var6 = pAllocationCallbacks->onFree;
      (pWav->allocationCallbacks).pUserData = pAllocationCallbacks->pUserData;
      (pWav->allocationCallbacks).onMalloc = p_Var4;
      (pWav->allocationCallbacks).onRealloc = p_Var5;
      (pWav->allocationCallbacks).onFree = p_Var6;
      if (p_Var6 == (_func_void_void_ptr_void_ptr *)0x0) {
        return 0;
      }
      if (p_Var4 == (_func_void_ptr_size_t_void_ptr *)0x0 &&
          p_Var5 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        return 0;
      }
    }
    (pWav->fmt).formatTag = (ma_uint16)pFormat->format;
    mVar1 = pFormat->channels;
    (pWav->fmt).channels = (ma_uint16)mVar1;
    mVar2 = pFormat->sampleRate;
    (pWav->fmt).sampleRate = mVar2;
    mVar3 = pFormat->bitsPerSample;
    uVar7 = mVar1 * mVar3;
    (pWav->fmt).avgBytesPerSec = mVar2 * uVar7 >> 3;
    (pWav->fmt).blockAlign = (ma_uint16)(uVar7 >> 3);
    (pWav->fmt).bitsPerSample = (ma_uint16)mVar3;
    (pWav->fmt).extendedSize = 0;
    pWav->isSequentialWrite = isSequential;
    mVar9 = 1;
  }
  return mVar9;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_preinit_write(ma_dr_wav* pWav, const ma_dr_wav_data_format* pFormat, ma_bool32 isSequential, ma_dr_wav_write_proc onWrite, ma_dr_wav_seek_proc onSeek, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onWrite == NULL) {
        return MA_FALSE;
    }
    if (!isSequential && onSeek == NULL) {
        return MA_FALSE;
    }
    if (pFormat->format == MA_DR_WAVE_FORMAT_EXTENSIBLE) {
        return MA_FALSE;
    }
    if (pFormat->format == MA_DR_WAVE_FORMAT_ADPCM || pFormat->format == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return MA_FALSE;
    }
    MA_DR_WAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onWrite   = onWrite;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pUserData;
    pWav->allocationCallbacks = ma_dr_wav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    pWav->fmt.formatTag = (ma_uint16)pFormat->format;
    pWav->fmt.channels = (ma_uint16)pFormat->channels;
    pWav->fmt.sampleRate = pFormat->sampleRate;
    pWav->fmt.avgBytesPerSec = (ma_uint32)((pFormat->bitsPerSample * pFormat->sampleRate * pFormat->channels) / 8);
    pWav->fmt.blockAlign = (ma_uint16)((pFormat->channels * pFormat->bitsPerSample) / 8);
    pWav->fmt.bitsPerSample = (ma_uint16)pFormat->bitsPerSample;
    pWav->fmt.extendedSize = 0;
    pWav->isSequentialWrite = isSequential;
    return MA_TRUE;
}